

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImplementation.hpp
# Opt level: O3

void __thiscall
SCSI::Target::Target<SCSI::DirectAccessDevice>::receive_data
          (Target<SCSI::DirectAccessDevice> *this,size_t length,continuation *next)

{
  this->bus_state_ = this->bus_state_ & 0xfffe77ff;
  this->phase_ = ReceivingData;
  std::function<void_(const_SCSI::Target::CommandState_&,_SCSI::Target::Responder_&)>::operator=
            (&this->next_function_,next);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,length);
  this->data_pointer_ = 0;
  this->expected_control_state_ = this->bus_state_ & 0x18800;
  Bus::set_device_output(this->bus_,this->scsi_bus_device_id_,this->bus_state_);
  return;
}

Assistant:

void Target<Executor>::receive_data(size_t length, continuation next) {
	// Data out phase: control, input and message all reset.
	bus_state_ &= ~(Line::Control | Line::Input | Line::Message);

	phase_ = Phase::ReceivingData;
	next_function_ = next;
	data_.resize(length);

	data_pointer_ = 0;
	set_device_output(bus_state_);
}